

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlayout.cpp
# Opt level: O0

int __thiscall QLayout::qt_metacall(QLayout *this,Call _c,int _id,void **_a)

{
  int iVar1;
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  int unaff_retaddr;
  Call unaff_retaddr_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = QObject::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  if ((-1 < iVar1) &&
     ((((in_ESI == 1 || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))))) {
    qt_static_metacall((QObject *)_a,unaff_retaddr_00,unaff_retaddr,
                       (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    iVar1 = iVar1 + -3;
  }
  return iVar1;
}

Assistant:

int QLayout::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    return _id;
}